

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int ns_parse_address(char *str,socket_address *sa,int *proto,int *use_ssl,char *cert,char *ca)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int len;
  uint port;
  int n;
  uint d;
  uint c;
  uint b;
  uint a;
  char host [200];
  
  n = 0;
  len = 0;
  *(undefined8 *)sa = 0;
  ((char *)((long)sa + 2))[6] = '\0';
  ((char *)((long)sa + 2))[7] = '\0';
  ((char *)((long)sa + 2))[8] = '\0';
  ((char *)((long)sa + 2))[9] = '\0';
  ((char *)((long)sa + 2))[10] = '\0';
  ((char *)((long)sa + 2))[0xb] = '\0';
  ((char *)((long)sa + 2))[0xc] = '\0';
  ((char *)((long)sa + 2))[0xd] = '\0';
  (sa->sa).sa_family = 2;
  *proto = 1;
  *use_ssl = 0;
  *ca = '\0';
  *cert = '\0';
  iVar2 = bcmp(str,"ssl://",6);
  if (iVar2 == 0) {
    *use_ssl = 1;
    str = str + 6;
  }
  else {
    iVar2 = bcmp(str,"udp://",6);
    if (iVar2 == 0) {
      *proto = 2;
      str = str + 6;
    }
    else {
      iVar2 = bcmp(str,"tcp://",6);
      if (iVar2 == 0) {
        str = str + 6;
      }
    }
  }
  iVar2 = __isoc99_sscanf(str,"%u.%u.%u.%u:%u%n",&a,&b,&c,&d,&port,&len);
  if (iVar2 == 5) {
    uVar3 = c << 8 | b << 0x10 | a << 0x18 | d;
    (sa->sin).sin_addr.s_addr =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | d << 0x18;
  }
  else {
    iVar2 = __isoc99_sscanf(str,"%199[^ :]:%u%n",host,&port,&len);
    if (iVar2 == 2) {
      (sa->sin).sin_port = (ushort)port << 8 | (ushort)port >> 8;
      uVar3 = ns_resolve2(host,&(sa->sin).sin_addr);
      goto LAB_0010504a;
    }
    uVar3 = __isoc99_sscanf(str,"%u%n",&port,&len);
    if (uVar3 != 1) goto LAB_0010504a;
  }
  uVar1 = (ushort)port << 8 | (ushort)port >> 8;
  uVar3 = (uint)uVar1;
  (sa->sin).sin_port = uVar1;
LAB_0010504a:
  if ((*use_ssl != 0) &&
     ((iVar2 = __isoc99_sscanf(str + len,":%99[^:]:%99[^:]%n",cert,ca,&n), iVar2 == 2 ||
      (uVar3 = __isoc99_sscanf(str + len,":%99[^:]%n",cert,&n), uVar3 == 1)))) {
    uVar3 = n;
  }
  return uVar3;
}

Assistant:

static int ns_parse_address(const char *str, union socket_address *sa,
                            int *proto, int *use_ssl, char *cert, char *ca) {
  unsigned int a, b, c, d, port;
  int n = 0, len = 0;
  char host[200];
#ifdef NS_ENABLE_IPV6
  char buf[100];
#endif

  // MacOS needs that. If we do not zero it, subsequent bind() will fail.
  // Also, all-zeroes in the socket address means binding to all addresses
  // for both IPv4 and IPv6 (INADDR_ANY and IN6ADDR_ANY_INIT).
  memset(sa, 0, sizeof(*sa));
  sa->sin.sin_family = AF_INET;

  *proto = SOCK_STREAM;
  *use_ssl = 0;
  cert[0] = ca[0] = '\0';

  if (memcmp(str, "ssl://", 6) == 0) {
    str += 6;
    *use_ssl = 1;
  } else if (memcmp(str, "udp://", 6) == 0) {
    str += 6;
    *proto = SOCK_DGRAM;
  } else if (memcmp(str, "tcp://", 6) == 0) {
    str += 6;
  }

  if (sscanf(str, "%u.%u.%u.%u:%u%n", &a, &b, &c, &d, &port, &len) == 5) {
    // Bind to a specific IPv4 address, e.g. 192.168.1.5:8080
    sa->sin.sin_addr.s_addr = htonl((a << 24) | (b << 16) | (c << 8) | d);
    sa->sin.sin_port = htons((uint16_t) port);
#ifdef NS_ENABLE_IPV6
  } else if (sscanf(str, "[%99[^]]]:%u%n", buf, &port, &len) == 2 &&
             inet_pton(AF_INET6, buf, &sa->sin6.sin6_addr)) {
    // IPv6 address, e.g. [3ffe:2a00:100:7031::1]:8080
    sa->sin6.sin6_family = AF_INET6;
    sa->sin6.sin6_port = htons((uint16_t) port);
#endif
  } else if (sscanf(str, "%199[^ :]:%u%n", host, &port, &len) == 2) {
    sa->sin.sin_port = htons((uint16_t) port);
    ns_resolve2(host, &sa->sin.sin_addr);
  } else if (sscanf(str, "%u%n", &port, &len) == 1) {
    // If only port is specified, bind to IPv4, INADDR_ANY
    sa->sin.sin_port = htons((uint16_t) port);
  }

  if (*use_ssl && (sscanf(str + len, ":%99[^:]:%99[^:]%n", cert, ca, &n) == 2 ||
                   sscanf(str + len, ":%99[^:]%n", cert, &n) == 1)) {
    len += n;
  }

  return port < 0xffff && str[len] == '\0' ? len : 0;
}